

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void perfetto::anon_unknown_4::AppendOwnedSlicesToPacket
               (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *data,size_t size
               ,size_t max_slice_size,TracePacket *packet)

{
  TracePacket *this;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *p_Var1;
  uint8_t *__dest;
  Slice local_a0;
  undefined1 local_88 [8];
  Slice slice;
  size_t slice_size;
  size_t size_left;
  uint8_t *src_ptr;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_48;
  Slice local_40;
  TracePacket *local_28;
  TracePacket *packet_local;
  size_t max_slice_size_local;
  size_t size_local;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *data_local;
  
  local_28 = packet;
  packet_local = (TracePacket *)max_slice_size;
  max_slice_size_local = size;
  size_local = (size_t)data;
  if (max_slice_size < size) {
    size_left = (size_t)std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                                  (data);
    slice_size = max_slice_size_local;
    while (slice_size != 0) {
      p_Var1 = (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
               ::std::min<unsigned_long>(&slice_size,(unsigned_long *)&packet_local);
      slice.own_data_._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           *(__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> *)
            &p_Var1->_M_t;
      Slice::Allocate((Slice *)local_88,
                      (size_t)slice.own_data_._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      __dest = Slice::own_data((Slice *)local_88);
      memcpy(__dest,(void *)size_left,
             (size_t)slice.own_data_._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      this = local_28;
      Slice::Slice(&local_a0,(Slice *)local_88);
      TracePacket::AddSlice(this,&local_a0);
      Slice::~Slice(&local_a0);
      size_left = (long)slice.own_data_._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + size_left;
      slice_size = slice_size -
                   (long)slice.own_data_._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      Slice::~Slice((Slice *)local_88);
    }
  }
  else {
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
              (&local_48,data);
    Slice::TakeOwnership(&local_40,&local_48,max_slice_size_local);
    TracePacket::AddSlice(packet,&local_40);
    Slice::~Slice(&local_40);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_48);
  }
  return;
}

Assistant:

void AppendOwnedSlicesToPacket(std::unique_ptr<uint8_t[]> data,
                               size_t size,
                               size_t max_slice_size,
                               perfetto::TracePacket* packet) {
  if (size <= max_slice_size) {
    packet->AddSlice(Slice::TakeOwnership(std::move(data), size));
    return;
  }
  uint8_t* src_ptr = data.get();
  for (size_t size_left = size; size_left > 0;) {
    const size_t slice_size = std::min(size_left, max_slice_size);

    Slice slice = Slice::Allocate(slice_size);
    memcpy(slice.own_data(), src_ptr, slice_size);
    packet->AddSlice(std::move(slice));

    src_ptr += slice_size;
    size_left -= slice_size;
  }
}